

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImDrawList::_ResetForNewFrame(ImDrawList *this)

{
  ImDrawCmd *in_RDI;
  ImDrawCmd *in_stack_ffffffffffffffc0;
  
  ImVector<ImDrawCmd>::resize
            ((ImVector<ImDrawCmd> *)in_stack_ffffffffffffffc0,(int)((ulong)in_RDI >> 0x20));
  ImVector<unsigned_short>::resize
            ((ImVector<unsigned_short> *)in_stack_ffffffffffffffc0,(int)((ulong)in_RDI >> 0x20));
  ImVector<ImDrawVert>::resize
            ((ImVector<ImDrawVert> *)in_stack_ffffffffffffffc0,(int)((ulong)in_RDI >> 0x20));
  *(undefined4 *)&in_RDI->UserCallbackData = *(undefined4 *)(*(long *)&in_RDI[1].ClipRect + 0x2c);
  memset(&in_RDI[2].VtxOffset,0,0x20);
  *(undefined4 *)((long)&in_RDI->UserCallbackData + 4) = 0;
  in_RDI[1].TextureId = (ImTextureID)0x0;
  in_RDI[1].VtxOffset = 0;
  in_RDI[1].IdxOffset = 0;
  ImVector<ImVec4>::resize
            ((ImVector<ImVec4> *)in_stack_ffffffffffffffc0,(int)((ulong)in_RDI >> 0x20));
  ImVector<void_*>::resize
            ((ImVector<void_*> *)in_stack_ffffffffffffffc0,(int)((ulong)in_RDI >> 0x20));
  ImVector<ImVec2>::resize
            ((ImVector<ImVec2> *)in_stack_ffffffffffffffc0,(int)((ulong)in_RDI >> 0x20));
  ImDrawListSplitter::Clear((ImDrawListSplitter *)(in_RDI + 3));
  ImDrawCmd::ImDrawCmd(in_stack_ffffffffffffffc0);
  ImVector<ImDrawCmd>::push_back((ImVector<ImDrawCmd> *)in_stack_ffffffffffffffc0,in_RDI);
  in_RDI[3].VtxOffset = 0x3f800000;
  return;
}

Assistant:

void ImDrawList::_ResetForNewFrame()
{
    // Verify that the ImDrawCmd fields we want to memcmp() are contiguous in memory.
    IM_STATIC_ASSERT(IM_OFFSETOF(ImDrawCmd, ClipRect) == 0);
    IM_STATIC_ASSERT(IM_OFFSETOF(ImDrawCmd, TextureId) == sizeof(ImVec4));
    IM_STATIC_ASSERT(IM_OFFSETOF(ImDrawCmd, VtxOffset) == sizeof(ImVec4) + sizeof(ImTextureID));

    CmdBuffer.resize(0);
    IdxBuffer.resize(0);
    VtxBuffer.resize(0);
    Flags = _Data->InitialFlags;
    memset(&_CmdHeader, 0, sizeof(_CmdHeader));
    _VtxCurrentIdx = 0;
    _VtxWritePtr = NULL;
    _IdxWritePtr = NULL;
    _ClipRectStack.resize(0);
    _TextureIdStack.resize(0);
    _Path.resize(0);
    _Splitter.Clear();
    CmdBuffer.push_back(ImDrawCmd());
    _FringeScale = 1.0f;
}